

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

void __thiscall cube::http::HTTPRequest::Reset(HTTPRequest *this)

{
  element_type *peVar1;
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [48];
  shared_ptr<cube::logging::Logger> local_20;
  HTTPRequest *local_10;
  HTTPRequest *this_local;
  
  local_10 = this;
  logging::GetLogger();
  peVar1 = std::__shared_ptr_access<cube::logging::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cube::logging::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_20);
  (*peVar1->_vptr_Logger[3])
            (peVar1,"%s|%d|%s|TRACE|\n",
             "/workspace/llm4binary/github/license_c_cmakelists/yplusplus[P]cube/net/http/http_request.cpp"
             ,0x68,"Reset");
  std::shared_ptr<cube::logging::Logger>::~shared_ptr(&local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"GET",&local_51);
  SetMethod(this,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"/",&local_79);
  SetURL(this,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  SetProto(this,(string *)HTTP_VERSION_1_1_abi_cxx11_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->m_headers);
  std::__cxx11::string::clear();
  this->m_parse_state = PARSE_REQUEST_LINE;
  return;
}

Assistant:

void HTTPRequest::Reset() {
    M_LOG_TRACE("");
    SetMethod("GET");
    SetURL("/");
    SetProto(HTTP_VERSION_1_1);
    m_headers.clear();
    m_body.clear();
    m_parse_state = PARSE_REQUEST_LINE;
}